

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::CacheState::getFullBarrier
          (CacheState *this,VkPipelineStageFlags *srcStages,VkAccessFlags *srcAccesses,
          VkPipelineStageFlags *dstStages,VkAccessFlags *dstAccesses)

{
  PipelineStage PVar1;
  PipelineStage PVar2;
  VkPipelineStageFlagBits VVar3;
  VkPipelineStageFlagBits flags;
  VkPipelineStageFlagBits flags_00;
  
  *srcStages = 0;
  *srcAccesses = 0;
  *dstStages = 0;
  *dstAccesses = 0;
  VVar3 = this->m_allowedStages;
  if (VVar3 != 0) {
    flags_00 = VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT;
    do {
      if ((VVar3 & flags_00) != 0) {
        PVar1 = pipelineStageFlagToPipelineStage(flags_00);
        if (this->m_incompleteOperations[PVar1] != 0) {
          *dstStages = *dstStages | flags_00;
          *srcStages = *srcStages | this->m_incompleteOperations[PVar1];
        }
        if (this->m_invisibleOperations[PVar1] != 0) {
          *dstStages = *dstStages | flags_00;
          *dstAccesses = *dstAccesses | this->m_invisibleOperations[PVar1];
        }
        VVar3 = this->m_allowedStages;
        if (VVar3 == 0) {
          VVar3 = 0;
        }
        else {
          flags = VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT;
          do {
            if ((VVar3 & flags) != 0) {
              PVar2 = pipelineStageFlagToPipelineStage(flags);
              if (this->m_unavailableWriteOperations[PVar1][PVar2] != 0) {
                *dstStages = *dstStages | flags_00;
                *srcStages = *srcStages | flags_00;
                *srcAccesses = *srcAccesses | this->m_unavailableWriteOperations[PVar1][PVar2];
              }
              if ((this->m_unavailableLayoutTransition[PVar1] == true) &&
                 (this->m_unavailableLayoutTransition[PVar2] == false)) {
                *dstStages = *dstStages | flags_00;
                *srcStages = *srcStages | flags_00;
              }
            }
            flags = flags * 2;
            VVar3 = this->m_allowedStages;
          } while (flags <= VVar3);
        }
      }
      flags_00 = flags_00 * 2;
    } while (flags_00 <= VVar3);
  }
  return;
}

Assistant:

void CacheState::getFullBarrier (vk::VkPipelineStageFlags&	srcStages,
								 vk::VkAccessFlags&			srcAccesses,
								 vk::VkPipelineStageFlags&	dstStages,
								 vk::VkAccessFlags&			dstAccesses) const
{
	srcStages	= 0;
	srcAccesses	= 0;
	dstStages	= 0;
	dstAccesses	= 0;

	for (vk::VkPipelineStageFlags dstStage_ = 1; dstStage_ <= m_allowedStages; dstStage_ <<= 1)
	{
		const PipelineStage dstStage = pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)dstStage_);

		if ((dstStage_ & m_allowedStages) == 0)
			continue;

		// Make sure all previous operation are complete in all stages
		if (m_incompleteOperations[dstStage])
		{
			dstStages |= dstStage_;
			srcStages |= m_incompleteOperations[dstStage];
		}

		// Make sure all read operations are visible in dstStage
		if (m_invisibleOperations[dstStage])
		{
			dstStages |= dstStage_;
			dstAccesses |= m_invisibleOperations[dstStage];
		}

		// Make sure all write operations fro mall stages are available
		for (vk::VkPipelineStageFlags srcStage_ = 1; srcStage_ <= m_allowedStages; srcStage_ <<= 1)
		{
			const PipelineStage srcStage = pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)srcStage_);

			if ((srcStage_ & m_allowedStages) == 0)
				continue;

			if (m_unavailableWriteOperations[dstStage][srcStage])
			{
				dstStages |= dstStage_;
				srcStages |= dstStage_;
				srcAccesses |= m_unavailableWriteOperations[dstStage][srcStage];
			}

			if (m_unavailableLayoutTransition[dstStage] && !m_unavailableLayoutTransition[srcStage])
			{
				// Add dependency between srcStage and dstStage if layout transition has not completed in dstStage,
				// but has completed in srcStage.
				dstStages |= dstStage_;
				srcStages |= dstStage_;
			}
		}
	}

	DE_ASSERT((srcStages & (~m_allowedStages)) == 0);
	DE_ASSERT((srcAccesses & (~m_allowedAccesses)) == 0);
	DE_ASSERT((dstStages & (~m_allowedStages)) == 0);
	DE_ASSERT((dstAccesses & (~m_allowedAccesses)) == 0);
}